

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_timestamp(void)

{
  char cVar1;
  int iVar2;
  int __fd;
  undefined1 *__buf;
  undefined1 *__s;
  void *__s1;
  void *__s2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  long lVar6;
  char *pcVar7;
  bson_json_error_code_t code;
  uint uVar8;
  ulong uVar9;
  bson_t compare;
  bson_t b;
  bson_error_t error;
  int iStack_780;
  int iStack_77c;
  char acStack_778 [504];
  undefined1 auStack_580 [360];
  undefined1 *puStack_418;
  undefined1 *puStack_410;
  code *pcStack_408;
  undefined1 auStack_400 [4];
  uint local_3fc;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [648];
  
  __buf = auStack_400;
  __s = local_2b8;
  pcStack_408 = (code *)0x1306f6;
  memset(__s,0,0x200);
  pcStack_408 = (code *)0x130701;
  bson_init(auStack_400);
  pcStack_408 = (code *)0x130720;
  bson_append_timestamp(auStack_400,"ts",2,0x589e8db9,0x4d2);
  pcStack_408 = (code *)0x13073e;
  cVar1 = bson_init_from_json(local_380,
                              "{\"ts\": {\"$timestamp\": {\"t\": 1486785977, \"i\": 1234}}}",
                              0xffffffffffffffff,__s);
  if (cVar1 != '\0') {
    pcStack_408 = (code *)0x130756;
    __buf = (undefined1 *)bson_get_data(local_380);
    pcStack_408 = (code *)0x130764;
    __s = (undefined1 *)bson_get_data(auStack_400);
    if (local_3fc == local_37c) {
      pcStack_408 = (code *)0x13077d;
      __s1 = (void *)bson_get_data(auStack_400);
      pcStack_408 = (code *)0x13078d;
      __s2 = (void *)bson_get_data(local_380);
      pcStack_408 = (code *)0x13079c;
      iVar2 = bcmp(__s1,__s2,(ulong)local_3fc);
      if (iVar2 == 0) {
        pcStack_408 = (code *)0x1307a8;
        bson_destroy(auStack_400);
        pcStack_408 = (code *)0x1307b5;
        bson_destroy(local_380);
        return;
      }
    }
    pcStack_408 = (code *)0x1307d6;
    uVar3 = bson_as_canonical_extended_json(local_380,0);
    pcStack_408 = (code *)0x1307e6;
    uVar4 = bson_as_canonical_extended_json(auStack_400,0);
    uVar8 = local_3fc;
    if (local_37c < local_3fc) {
      uVar8 = local_37c;
    }
    if (uVar8 != 0) {
      uVar8 = local_3fc;
      if (local_37c <= local_3fc) {
        uVar8 = local_37c;
      }
      uVar9 = 0;
      do {
        if (__buf[uVar9] != __s[uVar9]) {
          uVar9 = uVar9 & 0xffffffff;
          goto LAB_00130821;
        }
        uVar9 = uVar9 + 1;
      } while (uVar8 != (uint)uVar9);
    }
    uVar8 = local_37c;
    if (local_37c < local_3fc) {
      uVar8 = local_3fc;
    }
    uVar9 = (ulong)(uVar8 - 1);
LAB_00130821:
    pcStack_408 = (code *)0x13083f;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9,uVar3,uVar4);
    pcStack_408 = (code *)0x130857;
    iVar2 = open("failure.bad.bson",0x42,0x1a0);
    pcStack_408 = (code *)0x130872;
    __fd = open("failure.expected.bson",0x42,0x1a0);
    if (iVar2 == -1) {
LAB_001308be:
      pcStack_408 = (code *)0x1308c3;
      test_bson_json_timestamp_cold_6();
LAB_001308c3:
      pcStack_408 = (code *)0x1308c8;
      test_bson_json_timestamp_cold_5();
LAB_001308c8:
      pcStack_408 = (code *)0x1308cd;
      test_bson_json_timestamp_cold_2();
    }
    else {
      if (__fd == -1) goto LAB_001308c3;
      pcStack_408 = (code *)0x130896;
      uVar9 = write(iVar2,__buf,(ulong)local_37c);
      if (uVar9 != local_37c) goto LAB_001308c8;
      __buf = (undefined1 *)(ulong)local_3fc;
      pcStack_408 = (code *)0x1308ae;
      puVar5 = (undefined1 *)write(__fd,__s,(size_t)__buf);
      if (puVar5 == __buf) {
        pcStack_408 = (code *)0x1308be;
        test_bson_json_timestamp_cold_4();
        goto LAB_001308be;
      }
    }
    pcStack_408 = (code *)0x1308d2;
    test_bson_json_timestamp_cold_3();
  }
  pcStack_408 = test_bson_json_read_empty;
  test_bson_json_timestamp_cold_1();
  puStack_418 = __s;
  puStack_410 = __buf;
  pcStack_408 = (code *)&stack0xfffffffffffffff8;
  lVar6 = bson_new_from_json("",0,&iStack_780);
  if (lVar6 == 0) {
    if (iStack_780 != 1) goto LAB_00130997;
    if (iStack_77c != 2) goto LAB_0013099c;
    pcVar7 = strstr(acStack_778,"Empty JSON string");
    if (pcVar7 == (char *)0x0) goto LAB_001309a1;
    memset(&iStack_780,0,0x200);
    bson_init_from_json(auStack_580,"",0,&iStack_780);
    if (iStack_780 != 1) goto LAB_001309a9;
    if (iStack_77c == 2) {
      pcVar7 = strstr(acStack_778,"Empty JSON string");
      if (pcVar7 != (char *)0x0) {
        return;
      }
      goto LAB_001309b3;
    }
  }
  else {
    test_bson_json_read_empty_cold_1();
LAB_00130997:
    test_bson_json_read_empty_cold_2();
LAB_0013099c:
    test_bson_json_read_empty_cold_3();
LAB_001309a1:
    test_bson_json_read_empty_cold_7();
LAB_001309a9:
    test_bson_json_read_empty_cold_4();
  }
  test_bson_json_read_empty_cold_5();
LAB_001309b3:
  test_bson_json_read_empty_cold_6();
  test_bson_json_error
            ("{ \n      \"foo\" : { \n         \"$options\" : \"ism\"\n      }\n   }",2,code);
  return;
}

Assistant:

static void
test_bson_json_timestamp (void)
{
   bson_error_t error = {0};
   bson_t b, compare;
   bool r;

   bson_init (&compare);

   BSON_APPEND_TIMESTAMP (
      &compare, "ts", (uint32_t) 1486785977, (uint32_t) 1234);

   r = bson_init_from_json (
      &b,
      "{\"ts\": {\"$timestamp\": {\"t\": 1486785977, \"i\": 1234}}}",
      -1,
      &error);

   if (!r) {
      fprintf (stderr, "%s\n", error.message);
   }

   BSON_ASSERT (r);

   bson_eq_bson (&b, &compare);
   bson_destroy (&compare);
   bson_destroy (&b);
}